

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

Curl_addrinfo * addr_next_match(Curl_addrinfo *addr,int family)

{
  while( true ) {
    if (addr == (Curl_addrinfo *)0x0) {
      return (Curl_addrinfo *)0x0;
    }
    addr = addr->ai_next;
    if (addr == (Curl_addrinfo *)0x0) break;
    if (addr->ai_family == family) {
      return addr;
    }
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

static const struct Curl_addrinfo *
addr_next_match(const struct Curl_addrinfo *addr, int family)
{
  while(addr && addr->ai_next) {
    addr = addr->ai_next;
    if(addr->ai_family == family)
      return addr;
  }
  return NULL;
}